

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::anon_unknown_1::TestGroup::execute(Totals *__return_storage_ptr__,TestGroup *this)

{
  vectorStrings *this_00;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  reference pFVar4;
  IStreamingReporter *pIVar5;
  Totals *totals;
  string local_100;
  reference local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *invalidArg;
  const_iterator __end3;
  const_iterator __begin3;
  vectorStrings *__range3;
  FilterMatch *match;
  iterator __end2_1;
  iterator __begin2_1;
  Matches *__range2_1;
  reference local_68;
  TestCase **testCase;
  iterator __end2;
  iterator __begin2;
  Tests *__range2;
  string local_38;
  vectorStrings *local_18;
  vectorStrings *invalidArgs;
  TestGroup *this_local;
  
  invalidArgs = (vectorStrings *)this;
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar2 = (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  local_18 = TestSpec::getInvalidArgs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var,iVar2));
  Totals::Totals(__return_storage_ptr__);
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])();
  RunContext::testGroupStarting(&this->m_context,&local_38,1,1);
  std::__cxx11::string::~string((string *)&local_38);
  __end2 = clara::std::
           set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
           ::begin(&this->m_tests);
  testCase = (TestCase **)
             clara::std::
             set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
             ::end(&this->m_tests);
  while (bVar1 = clara::std::operator==(&__end2,(_Self *)&testCase), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_68 = clara::std::_Rb_tree_const_iterator<const_Catch::TestCase_*>::operator*(&__end2);
    bVar1 = RunContext::aborting(&this->m_context);
    if (bVar1) {
      pIVar5 = RunContext::reporter(&this->m_context);
      (*pIVar5->_vptr_IStreamingReporter[0xf])(pIVar5,*local_68);
    }
    else {
      RunContext::runTest((Totals *)&__range2_1,&this->m_context,*local_68);
      Totals::operator+=(__return_storage_ptr__,(Totals *)&__range2_1);
    }
    clara::std::_Rb_tree_const_iterator<const_Catch::TestCase_*>::operator++(&__end2);
  }
  __end2_1 = clara::std::
             vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
             begin(&this->m_matches);
  match = (FilterMatch *)
          clara::std::
          vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::end
                    (&this->m_matches);
  while (bVar1 = __gnu_cxx::
                 operator==<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                           (&__end2_1,
                            (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)&match), ((bVar1 ^ 0xffU) & 1) != 0) {
    pFVar4 = __gnu_cxx::
             __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
             ::operator*(&__end2_1);
    bVar1 = clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::
            empty(&pFVar4->tests);
    if (bVar1) {
      pIVar5 = RunContext::reporter(&this->m_context);
      (*pIVar5->_vptr_IStreamingReporter[3])(pIVar5,pFVar4);
      __return_storage_ptr__->error = -1;
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(local_18);
  this_00 = local_18;
  if (!bVar1) {
    __end3 = clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_18);
    invalidArg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 clara::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&invalidArg), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_e0 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
      pIVar5 = RunContext::reporter(&this->m_context);
      (*pIVar5->_vptr_IStreamingReporter[4])(pIVar5,local_e0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])();
  RunContext::testGroupEnded(&this->m_context,&local_100,__return_storage_ptr__,1,1);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

Totals execute() {
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();
                Totals totals;
                m_context.testGroupStarting(m_config->name(), 1, 1);
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_context.reporter().skipTest(*testCase);
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_context.reporter().noMatchingTestCases(match.name);
                        totals.error = -1;
                    }
                }

                if (!invalidArgs.empty()) {
                    for (auto const& invalidArg: invalidArgs)
                         m_context.reporter().reportInvalidArguments(invalidArg);
                }

                m_context.testGroupEnded(m_config->name(), totals, 1, 1);
                return totals;
            }